

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_network.cpp
# Opt level: O1

void __thiscall
polyscope::CurveNetwork::fillEdgeGeometryBuffers(CurveNetwork *this,ShaderProgram *program)

{
  undefined1 *indices;
  int iVar1;
  CurveNetworkNodeScalarQuantity *pCVar2;
  ManagedBuffer<float> *indices_00;
  undefined1 local_f0 [8];
  _Alloc_hider local_e8;
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  string local_b0 [16];
  undefined1 local_a0 [16];
  string local_90 [16];
  undefined1 local_80 [16];
  undefined8 local_70 [2];
  undefined1 local_60 [16];
  element_type *local_50 [4];
  
  local_50[0] = (element_type *)(local_50 + 2);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"a_position_tail","");
  indices = &(this->super_QuantityStructure<polyscope::CurveNetwork>).field_0x428;
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::getIndexedRenderAttributeBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_c0,
             (ManagedBuffer<unsigned_int> *)indices);
  (*program->_vptr_ShaderProgram[0x13])(program,local_50,local_c0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_);
  }
  if (local_50[0] != (element_type *)(local_50 + 2)) {
    operator_delete(local_50[0]);
  }
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"a_position_tip","");
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::getIndexedRenderAttributeBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_d0,
             (ManagedBuffer<unsigned_int> *)indices);
  (*program->_vptr_ShaderProgram[0x13])(program,local_70,local_d0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_);
  }
  if ((undefined1 *)local_70[0] != local_60) {
    operator_delete((void *)local_70[0]);
  }
  iVar1 = std::__cxx11::string::compare((char *)&this->nodeRadiusQuantityName);
  if (iVar1 != 0) {
    pCVar2 = resolveNodeRadiusQuantity(this);
    local_90._0_8_ = (ManagedBufferRegistry *)local_80;
    std::__cxx11::string::_M_construct<char_const*>(local_90,"a_tailRadius","");
    indices_00 = &(pCVar2->super_CurveNetworkScalarQuantity).
                  super_ScalarQuantity<polyscope::CurveNetworkScalarQuantity>.values;
    render::ManagedBuffer<float>::getIndexedRenderAttributeBuffer
              ((ManagedBuffer<float> *)local_e0,(ManagedBuffer<unsigned_int> *)indices_00);
    (*program->_vptr_ShaderProgram[0x13])(program,local_90,local_e0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_);
    }
    if ((ManagedBufferRegistry *)local_90._0_8_ != (ManagedBufferRegistry *)local_80) {
      operator_delete((void *)local_90._0_8_);
    }
    local_b0._0_8_ = local_a0;
    std::__cxx11::string::_M_construct<char_const*>(local_b0,"a_tipRadius","");
    render::ManagedBuffer<float>::getIndexedRenderAttributeBuffer
              ((ManagedBuffer<float> *)local_f0,(ManagedBuffer<unsigned_int> *)indices_00);
    (*program->_vptr_ShaderProgram[0x13])(program,local_b0,local_f0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_p);
    }
    if ((undefined1 *)local_b0._0_8_ != local_a0) {
      operator_delete((void *)local_b0._0_8_);
    }
  }
  return;
}

Assistant:

void CurveNetwork::fillEdgeGeometryBuffers(render::ShaderProgram& program) {
  program.setAttribute("a_position_tail", nodePositions.getIndexedRenderAttributeBuffer(edgeTailInds));
  program.setAttribute("a_position_tip", nodePositions.getIndexedRenderAttributeBuffer(edgeTipInds));

  if (nodeRadiusQuantityName != "") {
    CurveNetworkNodeScalarQuantity& nodeRadQ = resolveNodeRadiusQuantity();
    program.setAttribute("a_tailRadius", nodeRadQ.values.getIndexedRenderAttributeBuffer(edgeTailInds));
    program.setAttribute("a_tipRadius", nodeRadQ.values.getIndexedRenderAttributeBuffer(edgeTipInds));
  }
}